

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxMemberFunctionCall::FxMemberFunctionCall
          (FxMemberFunctionCall *this,FxExpression *self,FName *methodname,FArgumentList *args,
          FScriptPosition *pos)

{
  FScriptPosition *pos_local;
  FArgumentList *args_local;
  FName *methodname_local;
  FxExpression *self_local;
  FxMemberFunctionCall *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_MemberFunctionCall,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxMemberFunctionCall_00a0b0e0;
  FName::FName(&this->MethodName);
  TDeletingArray<FxExpression_*,_FxExpression_*>::TDeletingArray(&this->ArgList);
  this->Self = self;
  FName::operator=(&this->MethodName,methodname);
  TDeletingArray<FxExpression_*,_FxExpression_*>::operator=(&this->ArgList,args);
  return;
}

Assistant:

FxMemberFunctionCall::FxMemberFunctionCall(FxExpression *self, FName methodname, FArgumentList &args, const FScriptPosition &pos)
	: FxExpression(EFX_MemberFunctionCall, pos)
{
	Self = self;
	MethodName = methodname;
	ArgList = std::move(args);
}